

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

realtype N_VWrmsNorm_Serial(N_Vector x,N_Vector w)

{
  long lVar1;
  double dVar2;
  double local_50;
  realtype *wd;
  realtype *xd;
  realtype prodi;
  realtype sum;
  sunindextype N;
  sunindextype i;
  N_Vector w_local;
  N_Vector x_local;
  
  prodi = 0.0;
  lVar1 = *x->content;
  for (N = 0; N < lVar1; N = N + 1) {
    dVar2 = *(double *)(*(long *)((long)x->content + 0x10) + N * 8) *
            *(double *)(*(long *)((long)w->content + 0x10) + N * 8);
    prodi = dVar2 * dVar2 + prodi;
  }
  if (0.0 < prodi / (double)lVar1) {
    local_50 = sqrt(prodi / (double)lVar1);
  }
  else {
    local_50 = 0.0;
  }
  return local_50;
}

Assistant:

realtype N_VWrmsNorm_Serial(N_Vector x, N_Vector w)
{
  sunindextype i, N;
  realtype sum, prodi, *xd, *wd;

  sum = ZERO;
  xd = wd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  wd = NV_DATA_S(w);

  for (i = 0; i < N; i++) {
    prodi = xd[i]*wd[i];
    sum += SUNSQR(prodi);
  }

  return(SUNRsqrt(sum/N));
}